

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaAttrInfoPtr xmlSchemaGetFreshAttrInfo(xmlSchemaValidCtxtPtr vctxt)

{
  int iVar1;
  int iVar2;
  xmlSchemaAttrInfoPtr *ppxVar3;
  xmlSchemaAttrInfoPtr pxVar4;
  xmlChar *in_R8;
  char *extra;
  
  ppxVar3 = vctxt->attrInfos;
  if (ppxVar3 == (xmlSchemaAttrInfoPtr *)0x0) {
    ppxVar3 = (xmlSchemaAttrInfoPtr *)(*xmlMalloc)(8);
    vctxt->attrInfos = ppxVar3;
    vctxt->sizeAttrInfos = 1;
    if (ppxVar3 == (xmlSchemaAttrInfoPtr *)0x0) {
      vctxt->nberrors = vctxt->nberrors + 1;
      vctxt->err = 0x71a;
      extra = "allocating attribute info list";
      goto LAB_001cb61c;
    }
  }
  else {
    iVar1 = vctxt->sizeAttrInfos;
    iVar2 = vctxt->nbAttrInfos;
    if (iVar2 < iVar1) {
      vctxt->nbAttrInfos = iVar2 + 1;
      pxVar4 = ppxVar3[iVar2];
      if (pxVar4->localName != (xmlChar *)0x0) {
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaGetFreshAttrInfo",
                   "attr info not cleared",(xmlChar *)0x0,in_R8);
        return (xmlSchemaAttrInfoPtr)0x0;
      }
      pxVar4->nodeType = 2;
      return pxVar4;
    }
    vctxt->sizeAttrInfos = iVar1 + 1;
    ppxVar3 = (xmlSchemaAttrInfoPtr *)(*xmlRealloc)(ppxVar3,(long)iVar1 * 8 + 8);
    vctxt->attrInfos = ppxVar3;
    if (ppxVar3 == (xmlSchemaAttrInfoPtr *)0x0) {
      vctxt->nberrors = vctxt->nberrors + 1;
      vctxt->err = 0x71a;
      extra = "re-allocating attribute info list";
      goto LAB_001cb61c;
    }
  }
  pxVar4 = (xmlSchemaAttrInfoPtr)(*xmlMalloc)(0x70);
  if (pxVar4 != (xmlSchemaAttrInfoPtr)0x0) {
    *(undefined8 *)pxVar4 = 0;
    pxVar4->node = (xmlNodePtr)0x0;
    pxVar4->vcValue = (xmlChar *)0x0;
    pxVar4->parent = (xmlSchemaNodeInfoPtr)0x0;
    pxVar4->use = (xmlSchemaAttributeUsePtr_conflict)0x0;
    pxVar4->state = 0;
    pxVar4->metaType = 0;
    *(undefined8 *)&pxVar4->flags = 0;
    pxVar4->decl = (xmlSchemaAttributePtr)0x0;
    pxVar4->val = (xmlSchemaValPtr)0x0;
    pxVar4->typeDef = (xmlSchemaTypePtr)0x0;
    pxVar4->nsName = (xmlChar *)0x0;
    pxVar4->value = (xmlChar *)0x0;
    *(undefined8 *)&pxVar4->nodeLine = 0;
    pxVar4->localName = (xmlChar *)0x0;
    pxVar4->nodeType = 2;
    iVar1 = vctxt->nbAttrInfos;
    vctxt->nbAttrInfos = iVar1 + 1;
    vctxt->attrInfos[iVar1] = pxVar4;
    return pxVar4;
  }
  vctxt->nberrors = vctxt->nberrors + 1;
  vctxt->err = 0x71a;
  extra = "creating new attribute info";
LAB_001cb61c:
  __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,extra);
  return (xmlSchemaAttrInfoPtr)0x0;
}

Assistant:

static xmlSchemaAttrInfoPtr
xmlSchemaGetFreshAttrInfo(xmlSchemaValidCtxtPtr vctxt)
{
    xmlSchemaAttrInfoPtr iattr;
    /*
    * Grow/create list of attribute infos.
    */
    if (vctxt->attrInfos == NULL) {
	vctxt->attrInfos = (xmlSchemaAttrInfoPtr *)
	    xmlMalloc(sizeof(xmlSchemaAttrInfoPtr));
	vctxt->sizeAttrInfos = 1;
	if (vctxt->attrInfos == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"allocating attribute info list", NULL);
	    return (NULL);
	}
    } else if (vctxt->sizeAttrInfos <= vctxt->nbAttrInfos) {
	vctxt->sizeAttrInfos++;
	vctxt->attrInfos = (xmlSchemaAttrInfoPtr *)
	    xmlRealloc(vctxt->attrInfos,
		vctxt->sizeAttrInfos * sizeof(xmlSchemaAttrInfoPtr));
	if (vctxt->attrInfos == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"re-allocating attribute info list", NULL);
	    return (NULL);
	}
    } else {
	iattr = vctxt->attrInfos[vctxt->nbAttrInfos++];
	if (iattr->localName != NULL) {
	    VERROR_INT("xmlSchemaGetFreshAttrInfo",
		"attr info not cleared");
	    return (NULL);
	}
	iattr->nodeType = XML_ATTRIBUTE_NODE;
	return (iattr);
    }
    /*
    * Create an attribute info.
    */
    iattr = (xmlSchemaAttrInfoPtr)
	xmlMalloc(sizeof(xmlSchemaAttrInfo));
    if (iattr == NULL) {
	xmlSchemaVErrMemory(vctxt, "creating new attribute info", NULL);
	return (NULL);
    }
    memset(iattr, 0, sizeof(xmlSchemaAttrInfo));
    iattr->nodeType = XML_ATTRIBUTE_NODE;
    vctxt->attrInfos[vctxt->nbAttrInfos++] = iattr;

    return (iattr);
}